

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

float ImGui::ScaleRatioFromValueT<int,int,float>
                (ImGuiDataType data_type,int v,int v_min,int v_max,bool is_logarithmic,
                float logarithmic_zero_epsilon,float zero_deadzone_halfsize)

{
  bool bVar1;
  float fVar2;
  float fVar3;
  float local_74;
  float local_5c;
  float local_58;
  float local_54;
  float local_50;
  int local_4c;
  float zero_point_snap_R;
  float zero_point_snap_L;
  float zero_point_center;
  float result;
  float v_max_fudged;
  float v_min_fudged;
  bool flipped;
  int v_clamped;
  float zero_deadzone_halfsize_local;
  float logarithmic_zero_epsilon_local;
  int iStack_18;
  bool is_logarithmic_local;
  int v_max_local;
  int v_min_local;
  int v_local;
  ImGuiDataType data_type_local;
  
  if (v_min == v_max) {
    v_local = 0;
  }
  else {
    logarithmic_zero_epsilon_local = (float)v_max;
    iStack_18 = v_min;
    v_max_local = v;
    v_min_local = data_type;
    if (v_min < v_max) {
      local_4c = ImClamp<int>(v,v_min,v_max);
    }
    else {
      local_4c = ImClamp<int>(v,v_max,v_min);
    }
    if (is_logarithmic) {
      bVar1 = (int)logarithmic_zero_epsilon_local < iStack_18;
      if (bVar1) {
        ImSwap<int>(&stack0xffffffffffffffe8,(int *)&logarithmic_zero_epsilon_local);
      }
      fVar2 = ImAbs((float)iStack_18);
      if (logarithmic_zero_epsilon <= fVar2) {
        local_54 = (float)iStack_18;
      }
      else {
        local_50 = logarithmic_zero_epsilon;
        if ((float)iStack_18 < 0.0) {
          local_50 = -logarithmic_zero_epsilon;
        }
        local_54 = local_50;
      }
      result = local_54;
      fVar2 = ImAbs((float)(int)logarithmic_zero_epsilon_local);
      if (logarithmic_zero_epsilon <= fVar2) {
        local_5c = (float)(int)logarithmic_zero_epsilon_local;
      }
      else {
        local_58 = logarithmic_zero_epsilon;
        if ((float)(int)logarithmic_zero_epsilon_local < 0.0) {
          local_58 = -logarithmic_zero_epsilon;
        }
        local_5c = local_58;
      }
      zero_point_center = local_5c;
      if (((float)iStack_18 != 0.0) || (0.0 <= (float)(int)logarithmic_zero_epsilon_local)) {
        if (((float)(int)logarithmic_zero_epsilon_local == 0.0) &&
           ((!NAN((float)(int)logarithmic_zero_epsilon_local) && ((float)iStack_18 < 0.0)))) {
          zero_point_center = -logarithmic_zero_epsilon;
        }
      }
      else {
        result = -logarithmic_zero_epsilon;
      }
      if (result < (float)local_4c) {
        if ((float)local_4c < zero_point_center) {
          if (0.0 <= (float)(iStack_18 * (int)logarithmic_zero_epsilon_local)) {
            if (((float)iStack_18 < 0.0) || ((float)(int)logarithmic_zero_epsilon_local < 0.0)) {
              fVar2 = ImLog(-(float)local_4c / -zero_point_center);
              fVar3 = ImLog(-result / -zero_point_center);
              zero_point_snap_L = 1.0 - fVar2 / fVar3;
            }
            else {
              fVar2 = ImLog((float)local_4c / result);
              fVar3 = ImLog(zero_point_center / result);
              zero_point_snap_L = fVar2 / fVar3;
            }
          }
          else {
            zero_point_snap_L =
                 -(float)iStack_18 / ((float)(int)logarithmic_zero_epsilon_local - (float)iStack_18)
            ;
            if (((float)v_max_local != 0.0) || (NAN((float)v_max_local))) {
              if (0.0 <= (float)v_max_local) {
                fVar2 = ImLog((float)local_4c / logarithmic_zero_epsilon);
                fVar3 = ImLog(zero_point_center / logarithmic_zero_epsilon);
                zero_point_snap_L =
                     (fVar2 / fVar3) * (1.0 - (zero_point_snap_L + zero_deadzone_halfsize)) +
                     zero_point_snap_L + zero_deadzone_halfsize;
              }
              else {
                fVar2 = ImLog(-(float)local_4c / logarithmic_zero_epsilon);
                fVar3 = ImLog(-result / logarithmic_zero_epsilon);
                zero_point_snap_L =
                     (1.0 - fVar2 / fVar3) * (zero_point_snap_L - zero_deadzone_halfsize);
              }
            }
          }
        }
        else {
          zero_point_snap_L = 1.0;
        }
      }
      else {
        zero_point_snap_L = 0.0;
      }
      if (bVar1) {
        local_74 = 1.0 - zero_point_snap_L;
      }
      else {
        local_74 = zero_point_snap_L;
      }
      v_local = (int)local_74;
    }
    else {
      v_local = (int)((float)(local_4c - iStack_18) /
                     (float)((int)logarithmic_zero_epsilon_local - iStack_18));
    }
  }
  return (float)v_local;
}

Assistant:

float ImGui::ScaleRatioFromValueT(ImGuiDataType data_type, TYPE v, TYPE v_min, TYPE v_max, bool is_logarithmic, float logarithmic_zero_epsilon, float zero_deadzone_halfsize)
{
    if (v_min == v_max)
        return 0.0f;
    IM_UNUSED(data_type);

    const TYPE v_clamped = (v_min < v_max) ? ImClamp(v, v_min, v_max) : ImClamp(v, v_max, v_min);
    if (is_logarithmic)
    {
        bool flipped = v_max < v_min;

        if (flipped) // Handle the case where the range is backwards
            ImSwap(v_min, v_max);

        // Fudge min/max to avoid getting close to log(0)
        FLOATTYPE v_min_fudged = (ImAbs((FLOATTYPE)v_min) < logarithmic_zero_epsilon) ? ((v_min < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_min;
        FLOATTYPE v_max_fudged = (ImAbs((FLOATTYPE)v_max) < logarithmic_zero_epsilon) ? ((v_max < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_max;

        // Awkward special cases - we need ranges of the form (-100 .. 0) to convert to (-100 .. -epsilon), not (-100 .. epsilon)
        if ((v_min == 0.0f) && (v_max < 0.0f))
            v_min_fudged = -logarithmic_zero_epsilon;
        else if ((v_max == 0.0f) && (v_min < 0.0f))
            v_max_fudged = -logarithmic_zero_epsilon;

        float result;

        if (v_clamped <= v_min_fudged)
            result = 0.0f; // Workaround for values that are in-range but below our fudge
        else if (v_clamped >= v_max_fudged)
            result = 1.0f; // Workaround for values that are in-range but above our fudge
        else if ((v_min * v_max) < 0.0f) // Range crosses zero, so split into two portions
        {
            float zero_point_center = (-(float)v_min) / ((float)v_max - (float)v_min); // The zero point in parametric space.  There's an argument we should take the logarithmic nature into account when calculating this, but for now this should do (and the most common case of a symmetrical range works fine)
            float zero_point_snap_L = zero_point_center - zero_deadzone_halfsize;
            float zero_point_snap_R = zero_point_center + zero_deadzone_halfsize;
            if (v == 0.0f)
                result = zero_point_center; // Special case for exactly zero
            else if (v < 0.0f)
                result = (1.0f - (float)(ImLog(-(FLOATTYPE)v_clamped / logarithmic_zero_epsilon) / ImLog(-v_min_fudged / logarithmic_zero_epsilon))) * zero_point_snap_L;
            else
                result = zero_point_snap_R + ((float)(ImLog((FLOATTYPE)v_clamped / logarithmic_zero_epsilon) / ImLog(v_max_fudged / logarithmic_zero_epsilon)) * (1.0f - zero_point_snap_R));
        }
        else if ((v_min < 0.0f) || (v_max < 0.0f)) // Entirely negative slider
            result = 1.0f - (float)(ImLog(-(FLOATTYPE)v_clamped / -v_max_fudged) / ImLog(-v_min_fudged / -v_max_fudged));
        else
            result = (float)(ImLog((FLOATTYPE)v_clamped / v_min_fudged) / ImLog(v_max_fudged / v_min_fudged));

        return flipped ? (1.0f - result) : result;
    }

    // Linear slider
    return (float)((FLOATTYPE)(SIGNEDTYPE)(v_clamped - v_min) / (FLOATTYPE)(SIGNEDTYPE)(v_max - v_min));
}